

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O3

uLong cm_zlib_crc32_combine64(uLong crc1,uLong crc2,off_t len2)

{
  z_crc_t zVar1;
  z_crc_t p;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  zVar1 = x2nmodp(len2,(uint)crc2);
  uVar2 = 0;
  uVar3 = 0x80000000;
  do {
    if ((uVar3 & zVar1) != 0) {
      uVar2 = uVar2 ^ (uint)crc1;
      if ((uVar3 - 1 & zVar1) == 0) {
        return uVar2 ^ crc2;
      }
    }
    uVar3 = uVar3 >> 1;
    uVar4 = (uint)(crc1 >> 1) & 0x7fffffff;
    uVar5 = uVar4 ^ 0xedb88320;
    if ((crc1 & 1) == 0) {
      uVar5 = uVar4;
    }
    crc1 = (uLong)uVar5;
  } while( true );
}

Assistant:

uLong ZEXPORT crc32_combine64(crc1, crc2, len2)
    uLong crc1;
    uLong crc2;
    z_off64_t len2;
{
#ifdef DYNAMIC_CRC_TABLE
    once(&made, make_crc_table);
#endif /* DYNAMIC_CRC_TABLE */
    return multmodp(x2nmodp(len2, 3), crc1) ^ crc2;
}